

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  undefined2 uVar1;
  sqlite3 *psVar2;
  char *pcVar3;
  double dVar4;
  anon_union_8_5_44880d43_for_u aVar5;
  _func_void_void_ptr *p_Var6;
  u16 uVar7;
  u8 uVar8;
  u8 uVar9;
  
  if ((pTo->flags & 0x2460) != 0) {
    sqlite3VdbeMemReleaseExternal(pTo);
  }
  psVar2 = pFrom->db;
  pcVar3 = pFrom->z;
  dVar4 = pFrom->r;
  aVar5 = pFrom->u;
  uVar7 = pFrom->flags;
  uVar8 = pFrom->type;
  uVar9 = pFrom->enc;
  p_Var6 = pFrom->xDel;
  pTo->n = pFrom->n;
  pTo->flags = uVar7;
  pTo->type = uVar8;
  pTo->enc = uVar9;
  pTo->xDel = p_Var6;
  pTo->r = dVar4;
  pTo->u = aVar5;
  pTo->db = psVar2;
  pTo->z = pcVar3;
  pTo->xDel = (_func_void_void_ptr *)0x0;
  if ((pFrom->flags & 0x800) == 0) {
    uVar1 = pTo->flags;
    pTo->flags = uVar1 & 0xe3ff | (ushort)srcType;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( (pFrom->flags & MEM_RowSet)==0 );
  VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->xDel = 0;
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}